

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.hpp
# Opt level: O2

void __thiscall
vkt::sparse::SparseShaderIntrinsicsCaseBase::SparseShaderIntrinsicsCaseBase
          (SparseShaderIntrinsicsCaseBase *this,TestContext *testCtx,string *name,
          SpirVFunction function,ImageType imageType,UVec3 *imageSize,TextureFormat *format)

{
  allocator<char> local_59;
  UVec3 *local_58;
  string local_50;
  
  local_58 = imageSize;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_59);
  TestCase::TestCase(&this->super_TestCase,testCtx,name,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00c07b70;
  this->m_function = function;
  this->m_imageType = imageType;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_imageSize,local_58);
  this->m_format = *format;
  return;
}

Assistant:

SparseShaderIntrinsicsCaseBase			(tcu::TestContext&			testCtx,
											 const std::string&			name,
											 const SpirVFunction		function,
											 const ImageType			imageType,
											 const tcu::UVec3&			imageSize,
											 const tcu::TextureFormat&	format)
		: TestCase(testCtx, name, "")
		, m_function(function)
		, m_imageType(imageType)
		, m_imageSize(imageSize)
		, m_format(format)
	{
	}